

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

string * __thiscall
t_swift_generator::promise_function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_function *tfunction)

{
  t_struct *tstruct;
  t_type *ttype;
  string local_178;
  allocator local_151;
  string local_150;
  string local_130;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  t_function *local_20;
  t_function *tfunction_local;
  t_swift_generator *this_local;
  
  local_20 = tfunction;
  tfunction_local = (t_function *)this;
  this_local = (t_swift_generator *)__return_storage_ptr__;
  function_name_abi_cxx11_(&local_100,this,tfunction);
  std::operator+(&local_e0,"func ",&local_100);
  std::operator+(&local_c0,&local_e0,"(");
  tstruct = t_function::get_arglist(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"",&local_151);
  argument_list(&local_130,this,tstruct,&local_150,false);
  std::operator+(&local_a0,&local_c0,&local_130);
  std::operator+(&local_80,&local_a0,") throws ");
  std::operator+(&local_60,&local_80,"-> Promise<");
  ttype = t_function::get_returntype(local_20);
  type_name_abi_cxx11_(&local_178,this,ttype,false,false);
  std::operator+(&local_40,&local_60,&local_178);
  std::operator+(__return_storage_ptr__,&local_40,">");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::promise_function_signature(t_function* tfunction) {
  return "func " + function_name(tfunction) + "(" + argument_list(tfunction->get_arglist(), "", false) + ") throws "
         + "-> Promise<" + type_name(tfunction->get_returntype()) + ">";
}